

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdGetSchnorrPubkeyFromPubkey(void *handle,char *pubkey,char **schnorr_pubkey,bool *parity)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  undefined1 local_78 [32];
  Pubkey pubkey_obj;
  SchnorrPubkey schnorr_pubkey_obj;
  
  cfd::Initialize();
  if (schnorr_pubkey == (char **)0x0) {
    local_78._0_8_ = "cfdcapi_key.cpp";
    local_78._8_4_ = 0x1c2;
    local_78._16_8_ = "CfdGetSchnorrPubkeyFromPubkey";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_78,"schnorr pubkey is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_78,"Failed to parameter. schnorr pubkey is null.",
               (allocator *)&pubkey_obj);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_78);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(pubkey);
  if (!bVar1) {
    std::__cxx11::string::string((string *)local_78,pubkey,(allocator *)&schnorr_pubkey_obj);
    cfd::core::Pubkey::Pubkey(&pubkey_obj,(string *)local_78);
    std::__cxx11::string::~string((string *)local_78);
    cfd::core::SchnorrPubkey::FromPubkey(&schnorr_pubkey_obj,&pubkey_obj,parity);
    cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)local_78,&schnorr_pubkey_obj);
    pcVar2 = cfd::capi::CreateString((string *)local_78);
    *schnorr_pubkey = pcVar2;
    std::__cxx11::string::~string((string *)local_78);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey_obj);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey_obj);
    return 0;
  }
  local_78._0_8_ = "cfdcapi_key.cpp";
  local_78._8_4_ = 0x1c8;
  local_78._16_8_ = "CfdGetSchnorrPubkeyFromPubkey";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_78,"pubkey is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_78,"Failed to parameter. pubkey is null or empty.",
             (allocator *)&pubkey_obj);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_78);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetSchnorrPubkeyFromPubkey(
    void* handle, const char* pubkey, char** schnorr_pubkey, bool* parity) {
  try {
    cfd::Initialize();
    if (schnorr_pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "schnorr pubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. schnorr pubkey is null.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }

    Pubkey pubkey_obj = Pubkey(std::string(pubkey));
    SchnorrPubkey schnorr_pubkey_obj =
        SchnorrPubkey::FromPubkey(pubkey_obj, parity);
    *schnorr_pubkey = CreateString(schnorr_pubkey_obj.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}